

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_rank(void **param_1)

{
  roaring64_bitmap_t *r;
  uint64_t uVar1;
  uint64_t uVar2;
  unsigned_long b;
  
  uVar2 = 0;
  r = roaring64_bitmap_create();
  do {
    roaring64_bitmap_add(r,uVar2);
    uVar2 = uVar2 + 1000;
  } while (uVar2 != 100000);
  b = 1;
  uVar2 = 0;
  do {
    uVar1 = roaring64_bitmap_rank(r,uVar2);
    _assert_int_equal(uVar1,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                      ,0x232);
    uVar1 = roaring64_bitmap_rank(r,uVar2 + 1);
    _assert_int_equal(uVar1,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                      ,0x233);
    b = b + 1;
    uVar2 = uVar2 + 1000;
  } while (b != 0x65);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_rank) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_add(r, i * 1000);
    }
    for (uint64_t i = 0; i < 100; ++i) {
        assert_int_equal(roaring64_bitmap_rank(r, i * 1000), i + 1);
        assert_int_equal(roaring64_bitmap_rank(r, i * 1000 + 1), i + 1);
    }
    roaring64_bitmap_free(r);
}